

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O2

btWheelInfo * __thiscall
btRaycastVehicle::addWheel
          (btRaycastVehicle *this,btVector3 *connectionPointCS,btVector3 *wheelDirectionCS0,
          btVector3 *wheelAxleCS,btScalar suspensionRestLength,btScalar wheelRadius,
          btVehicleTuning *tuning,bool isFrontWheel)

{
  btWheelInfo *wheel;
  btWheelInfo bStack_138;
  
  bStack_138.m_suspensionStiffness = *(btScalar *)tuning;
  bStack_138.m_wheelsDampingCompression = *(btScalar *)(tuning + 4);
  bStack_138.m_wheelsDampingRelaxation = *(btScalar *)(tuning + 8);
  bStack_138.m_maxSuspensionTravelCm = *(btScalar *)(tuning + 0xc);
  bStack_138.m_maxSuspensionForce = *(btScalar *)(tuning + 0x14);
  bStack_138.m_frictionSlip = *(btScalar *)(tuning + 0x10);
  bStack_138.m_chassisConnectionPointCS.m_floats._0_8_ = *(undefined8 *)connectionPointCS->m_floats;
  bStack_138.m_chassisConnectionPointCS.m_floats._8_8_ =
       *(undefined8 *)(connectionPointCS->m_floats + 2);
  bStack_138.m_wheelDirectionCS.m_floats._0_8_ = *(undefined8 *)wheelDirectionCS0->m_floats;
  bStack_138.m_wheelDirectionCS.m_floats._8_8_ = *(undefined8 *)(wheelDirectionCS0->m_floats + 2);
  bStack_138.m_wheelAxleCS.m_floats._0_8_ = *(undefined8 *)wheelAxleCS->m_floats;
  bStack_138.m_wheelAxleCS.m_floats._8_8_ = *(undefined8 *)(wheelAxleCS->m_floats + 2);
  bStack_138.m_engineForce = 0.0;
  bStack_138.m_brake = 0.0;
  bStack_138.m_steering = 0.0;
  bStack_138.m_rotation = 0.0;
  bStack_138.m_deltaRotation = 0.0;
  bStack_138.m_rollInfluence = 0.1;
  bStack_138.m_suspensionRestLength1 = suspensionRestLength;
  bStack_138.m_wheelsRadius = wheelRadius;
  bStack_138.m_bIsFrontWheel = isFrontWheel;
  btAlignedObjectArray<btWheelInfo>::push_back(&this->m_wheelInfo,&bStack_138);
  wheel = (this->m_wheelInfo).m_data + (long)(this->m_wheelInfo).m_size + -1;
  updateWheelTransformsWS(this,wheel,false);
  updateWheelTransform(this,(this->m_wheelInfo).m_size + -1,false);
  return wheel;
}

Assistant:

btWheelInfo&	btRaycastVehicle::addWheel( const btVector3& connectionPointCS, const btVector3& wheelDirectionCS0,const btVector3& wheelAxleCS, btScalar suspensionRestLength, btScalar wheelRadius,const btVehicleTuning& tuning, bool isFrontWheel)
{

	btWheelInfoConstructionInfo ci;

	ci.m_chassisConnectionCS = connectionPointCS;
	ci.m_wheelDirectionCS = wheelDirectionCS0;
	ci.m_wheelAxleCS = wheelAxleCS;
	ci.m_suspensionRestLength = suspensionRestLength;
	ci.m_wheelRadius = wheelRadius;
	ci.m_suspensionStiffness = tuning.m_suspensionStiffness;
	ci.m_wheelsDampingCompression = tuning.m_suspensionCompression;
	ci.m_wheelsDampingRelaxation = tuning.m_suspensionDamping;
	ci.m_frictionSlip = tuning.m_frictionSlip;
	ci.m_bIsFrontWheel = isFrontWheel;
	ci.m_maxSuspensionTravelCm = tuning.m_maxSuspensionTravelCm;
	ci.m_maxSuspensionForce = tuning.m_maxSuspensionForce;

	m_wheelInfo.push_back( btWheelInfo(ci));
	
	btWheelInfo& wheel = m_wheelInfo[getNumWheels()-1];
	
	updateWheelTransformsWS( wheel , false );
	updateWheelTransform(getNumWheels()-1,false);
	return wheel;
}